

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float *pfVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  size_t k;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  byte bVar32;
  byte bVar33;
  bool bVar34;
  uint uVar35;
  float *vertices;
  long lVar36;
  long lVar37;
  undefined1 (*pauVar38) [32];
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  ulong *puVar42;
  NodeRef root;
  size_t i_1;
  long lVar43;
  undefined4 uVar44;
  ulong uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  int aiVar57 [8];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar61 [32];
  undefined1 auVar65 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar92 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vuint<4> *v;
  vfloat<8> t;
  vfloat<8> v_1;
  vfloat<8> u;
  TravRayK<8,_false> tray;
  Vec3vf<8> Ng;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5e24;
  Precalculations local_5dfd;
  undefined4 local_5dfc;
  uint local_5df8;
  undefined4 local_5df4;
  RTCFilterFunctionNArguments local_5df0;
  RayK<8> *local_5dc0;
  Geometry *local_5db8;
  BVH *local_5db0;
  Intersectors *local_5da8;
  long local_5da0;
  long local_5d98;
  Scene *local_5d90;
  long local_5d88;
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined8 local_5d20;
  undefined8 uStack_5d18;
  undefined8 local_5d10;
  undefined8 uStack_5d08;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5d00;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5ce0;
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [8];
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  undefined1 local_5c60 [8];
  float fStack_5c58;
  float fStack_5c54;
  float fStack_5c50;
  float fStack_5c4c;
  float fStack_5c48;
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c20;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  undefined4 uStack_5b64;
  undefined1 local_5b60 [32];
  uint local_5b40;
  uint uStack_5b3c;
  uint uStack_5b38;
  uint uStack_5b34;
  uint uStack_5b30;
  uint uStack_5b2c;
  uint uStack_5b28;
  uint uStack_5b24;
  uint local_5b20;
  uint uStack_5b1c;
  uint uStack_5b18;
  uint uStack_5b14;
  uint uStack_5b10;
  uint uStack_5b0c;
  uint uStack_5b08;
  uint uStack_5b04;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5b00;
  RTCRayQueryContext local_5ae0 [4];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5ac0;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5aa0;
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  float local_5980;
  float fStack_597c;
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  undefined4 uStack_5964;
  float local_5960;
  float fStack_595c;
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined4 uStack_5944;
  undefined1 local_5940 [32];
  int local_5920;
  int iStack_591c;
  int iStack_5918;
  int iStack_5914;
  int iStack_5910;
  int iStack_590c;
  int iStack_5908;
  int iStack_5904;
  uint local_5900;
  uint uStack_58fc;
  uint uStack_58f8;
  uint uStack_58f4;
  uint uStack_58f0;
  uint uStack_58ec;
  uint uStack_58e8;
  uint uStack_58e4;
  uint local_58e0;
  uint uStack_58dc;
  uint uStack_58d8;
  uint uStack_58d4;
  uint uStack_58d0;
  uint uStack_58cc;
  uint uStack_58c8;
  uint uStack_58c4;
  uint local_58c0;
  uint uStack_58bc;
  uint uStack_58b8;
  uint uStack_58b4;
  uint uStack_58b0;
  uint uStack_58ac;
  uint uStack_58a8;
  uint uStack_58a4;
  undefined1 local_58a0 [32];
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5860;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5840;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  undefined1 auVar53 [32];
  
  local_5db0 = (BVH *)This->ptr;
  local_5808 = (local_5db0->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar49 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar46 = ZEXT816(0) << 0x40;
      uVar45 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar46),5);
      uVar40 = vpcmpeqd_avx512vl(auVar49,(undefined1  [32])valid_i->field_0);
      uVar45 = uVar45 & uVar40;
      bVar33 = (byte)uVar45;
      if (bVar33 != 0) {
        local_5aa0._0_4_ = *(float *)ray;
        local_5aa0._4_4_ = *(float *)(ray + 4);
        local_5aa0._8_4_ = *(float *)(ray + 8);
        local_5aa0._12_4_ = *(float *)(ray + 0xc);
        local_5aa0._16_4_ = *(float *)(ray + 0x10);
        local_5aa0._20_4_ = *(float *)(ray + 0x14);
        local_5aa0._24_4_ = *(float *)(ray + 0x18);
        local_5aa0._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5aa0._32_4_ = *(float *)(ray + 0x20);
        local_5aa0._36_4_ = *(float *)(ray + 0x24);
        local_5aa0._40_4_ = *(float *)(ray + 0x28);
        local_5aa0._44_4_ = *(float *)(ray + 0x2c);
        local_5aa0._48_4_ = *(float *)(ray + 0x30);
        local_5aa0._52_4_ = *(float *)(ray + 0x34);
        local_5aa0._56_4_ = *(float *)(ray + 0x38);
        local_5aa0._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5aa0._64_4_ = *(float *)(ray + 0x40);
        local_5aa0._68_4_ = *(float *)(ray + 0x44);
        local_5aa0._72_4_ = *(float *)(ray + 0x48);
        local_5aa0._76_4_ = *(float *)(ray + 0x4c);
        local_5aa0._80_4_ = *(float *)(ray + 0x50);
        local_5aa0._84_4_ = *(float *)(ray + 0x54);
        local_5aa0._88_4_ = *(float *)(ray + 0x58);
        local_5aa0._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_5a40 = *(undefined1 (*) [32])(ray + 0x80);
        local_5a20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5a00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar51._8_4_ = 0x7fffffff;
        auVar51._0_8_ = 0x7fffffff7fffffff;
        auVar51._12_4_ = 0x7fffffff;
        auVar51._16_4_ = 0x7fffffff;
        auVar51._20_4_ = 0x7fffffff;
        auVar51._24_4_ = 0x7fffffff;
        auVar51._28_4_ = 0x7fffffff;
        auVar49 = vandps_avx(auVar51,local_5a40);
        auVar47._8_4_ = 0x219392ef;
        auVar47._0_8_ = 0x219392ef219392ef;
        auVar47._12_4_ = 0x219392ef;
        auVar47._16_4_ = 0x219392ef;
        auVar47._20_4_ = 0x219392ef;
        auVar47._24_4_ = 0x219392ef;
        auVar47._28_4_ = 0x219392ef;
        uVar40 = vcmpps_avx512vl(auVar49,auVar47,1);
        bVar34 = (bool)((byte)uVar40 & 1);
        auVar48._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a40._0_4_;
        bVar34 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a40._4_4_;
        bVar34 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a40._8_4_;
        bVar34 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a40._12_4_;
        bVar34 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a40._16_4_;
        bVar34 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a40._20_4_;
        bVar34 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a40._24_4_;
        bVar34 = SUB81(uVar40 >> 7,0);
        auVar48._28_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a40._28_4_;
        auVar49 = vandps_avx(auVar51,local_5a20);
        uVar40 = vcmpps_avx512vl(auVar49,auVar47,1);
        bVar34 = (bool)((byte)uVar40 & 1);
        auVar52._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a20._0_4_;
        bVar34 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a20._4_4_;
        bVar34 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a20._8_4_;
        bVar34 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a20._12_4_;
        bVar34 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a20._16_4_;
        bVar34 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a20._20_4_;
        bVar34 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a20._24_4_;
        bVar34 = SUB81(uVar40 >> 7,0);
        auVar52._28_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a20._28_4_;
        auVar49 = vandps_avx(auVar51,local_5a00);
        uVar40 = vcmpps_avx512vl(auVar49,auVar47,1);
        bVar34 = (bool)((byte)uVar40 & 1);
        auVar49._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a00._0_4_;
        bVar34 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar49._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a00._4_4_;
        bVar34 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar49._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a00._8_4_;
        bVar34 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar49._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a00._12_4_;
        bVar34 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar49._16_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a00._16_4_;
        bVar34 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar49._20_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a00._20_4_;
        bVar34 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar49._24_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a00._24_4_;
        bVar34 = SUB81(uVar40 >> 7,0);
        auVar49._28_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * local_5a00._28_4_;
        auVar50._8_4_ = 0x3f800000;
        auVar50._0_8_ = 0x3f8000003f800000;
        auVar50._12_4_ = 0x3f800000;
        auVar50._16_4_ = 0x3f800000;
        auVar50._20_4_ = 0x3f800000;
        auVar50._24_4_ = 0x3f800000;
        auVar50._28_4_ = 0x3f800000;
        auVar47 = vrcp14ps_avx512vl(auVar48);
        auVar18 = vfnmadd213ps_fma(auVar48,auVar47,auVar50);
        auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar47,auVar47);
        auVar48 = vrcp14ps_avx512vl(auVar52);
        auVar19 = vfnmadd213ps_fma(auVar52,auVar48,auVar50);
        auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar48,auVar48);
        auVar48 = vrcp14ps_avx512vl(auVar49);
        auVar20 = vfnmadd213ps_fma(auVar49,auVar48,auVar50);
        local_59e0 = ZEXT1632(auVar18);
        local_59c0 = ZEXT1632(auVar19);
        auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar48,auVar48);
        local_59a0 = ZEXT1632(auVar20);
        local_5940._4_4_ = *(float *)(ray + 0x44) * auVar20._4_4_;
        local_5940._0_4_ = *(float *)(ray + 0x40) * auVar20._0_4_;
        local_5940._8_4_ = *(float *)(ray + 0x48) * auVar20._8_4_;
        local_5940._12_4_ = *(float *)(ray + 0x4c) * auVar20._12_4_;
        local_5940._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_5940._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_5940._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_5940._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_5980 = *(float *)ray * auVar18._0_4_;
        fStack_597c = *(float *)(ray + 4) * auVar18._4_4_;
        fStack_5978 = *(float *)(ray + 8) * auVar18._8_4_;
        fStack_5974 = *(float *)(ray + 0xc) * auVar18._12_4_;
        fStack_5970 = *(float *)(ray + 0x10) * 0.0;
        fStack_596c = *(float *)(ray + 0x14) * 0.0;
        fStack_5968 = *(float *)(ray + 0x18) * 0.0;
        uStack_5964 = *(undefined4 *)(ray + 0x1c);
        local_5960 = *(float *)(ray + 0x20) * auVar19._0_4_;
        fStack_595c = *(float *)(ray + 0x24) * auVar19._4_4_;
        fStack_5958 = *(float *)(ray + 0x28) * auVar19._8_4_;
        fStack_5954 = *(float *)(ray + 0x2c) * auVar19._12_4_;
        fStack_5950 = *(float *)(ray + 0x30) * 0.0;
        fStack_594c = *(float *)(ray + 0x34) * 0.0;
        fStack_5948 = *(float *)(ray + 0x38) * 0.0;
        uStack_5944 = *(undefined4 *)(ray + 0x3c);
        uVar40 = vcmpps_avx512vl(ZEXT1632(auVar18),ZEXT1632(auVar46),1);
        auVar49 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5920 = (uint)((byte)uVar40 & 1) * auVar49._0_4_;
        iStack_591c = (uint)((byte)(uVar40 >> 1) & 1) * auVar49._4_4_;
        iStack_5918 = (uint)((byte)(uVar40 >> 2) & 1) * auVar49._8_4_;
        iStack_5914 = (uint)((byte)(uVar40 >> 3) & 1) * auVar49._12_4_;
        iStack_5910 = (uint)((byte)(uVar40 >> 4) & 1) * auVar49._16_4_;
        iStack_590c = (uint)((byte)(uVar40 >> 5) & 1) * auVar49._20_4_;
        iStack_5908 = (uint)((byte)(uVar40 >> 6) & 1) * auVar49._24_4_;
        iStack_5904 = (uint)(byte)(uVar40 >> 7) * auVar49._28_4_;
        auVar48 = ZEXT1632(auVar46);
        uVar40 = vcmpps_avx512vl(ZEXT1632(auVar19),auVar48,5);
        auVar49 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar34 = (bool)((byte)uVar40 & 1);
        bVar4 = (bool)((byte)(uVar40 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar40 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar40 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar40 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar40 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar40 >> 6) & 1);
        bVar10 = SUB81(uVar40 >> 7,0);
        local_5900 = (uint)bVar34 * auVar49._0_4_ | (uint)!bVar34 * 0x60;
        uStack_58fc = (uint)bVar4 * auVar49._4_4_ | (uint)!bVar4 * 0x60;
        uStack_58f8 = (uint)bVar5 * auVar49._8_4_ | (uint)!bVar5 * 0x60;
        uStack_58f4 = (uint)bVar6 * auVar49._12_4_ | (uint)!bVar6 * 0x60;
        uStack_58f0 = (uint)bVar7 * auVar49._16_4_ | (uint)!bVar7 * 0x60;
        uStack_58ec = (uint)bVar8 * auVar49._20_4_ | (uint)!bVar8 * 0x60;
        uStack_58e8 = (uint)bVar9 * auVar49._24_4_ | (uint)!bVar9 * 0x60;
        uStack_58e4 = (uint)bVar10 * auVar49._28_4_ | (uint)!bVar10 * 0x60;
        uVar40 = vcmpps_avx512vl(ZEXT1632(auVar20),auVar48,5);
        auVar49 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar34 = (bool)((byte)uVar40 & 1);
        bVar4 = (bool)((byte)(uVar40 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar40 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar40 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar40 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar40 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar40 >> 6) & 1);
        bVar10 = SUB81(uVar40 >> 7,0);
        local_58e0 = (uint)bVar34 * auVar49._0_4_ | (uint)!bVar34 * 0xa0;
        uStack_58dc = (uint)bVar4 * auVar49._4_4_ | (uint)!bVar4 * 0xa0;
        uStack_58d8 = (uint)bVar5 * auVar49._8_4_ | (uint)!bVar5 * 0xa0;
        uStack_58d4 = (uint)bVar6 * auVar49._12_4_ | (uint)!bVar6 * 0xa0;
        uStack_58d0 = (uint)bVar7 * auVar49._16_4_ | (uint)!bVar7 * 0xa0;
        uStack_58cc = (uint)bVar8 * auVar49._20_4_ | (uint)!bVar8 * 0xa0;
        uStack_58c8 = (uint)bVar9 * auVar49._24_4_ | (uint)!bVar9 * 0xa0;
        uStack_58c4 = (uint)bVar10 * auVar49._28_4_ | (uint)!bVar10 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar90 = ZEXT3264(local_4680);
        auVar49 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar48);
        local_58c0 = (uint)(bVar33 & 1) * auVar49._0_4_ |
                     (uint)!(bool)(bVar33 & 1) * local_4680._0_4_;
        bVar34 = (bool)((byte)(uVar45 >> 1) & 1);
        uStack_58bc = (uint)bVar34 * auVar49._4_4_ | (uint)!bVar34 * local_4680._4_4_;
        bVar34 = (bool)((byte)(uVar45 >> 2) & 1);
        uStack_58b8 = (uint)bVar34 * auVar49._8_4_ | (uint)!bVar34 * local_4680._8_4_;
        bVar34 = (bool)((byte)(uVar45 >> 3) & 1);
        uStack_58b4 = (uint)bVar34 * auVar49._12_4_ | (uint)!bVar34 * local_4680._12_4_;
        bVar34 = (bool)((byte)(uVar45 >> 4) & 1);
        uStack_58b0 = (uint)bVar34 * auVar49._16_4_ | (uint)!bVar34 * local_4680._16_4_;
        bVar34 = (bool)((byte)(uVar45 >> 5) & 1);
        uStack_58ac = (uint)bVar34 * auVar49._20_4_ | (uint)!bVar34 * local_4680._20_4_;
        bVar34 = (bool)((byte)(uVar45 >> 6) & 1);
        uStack_58a8 = (uint)bVar34 * auVar49._24_4_ | (uint)!bVar34 * local_4680._24_4_;
        bVar34 = SUB81(uVar45 >> 7,0);
        uStack_58a4 = (uint)bVar34 * auVar49._28_4_ | (uint)!bVar34 * local_4680._28_4_;
        local_5dfc = (undefined4)uVar45;
        auVar49 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar48);
        local_58a0._0_4_ =
             (uint)(bVar33 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar33 & 1) * -0x800000;
        bVar34 = (bool)((byte)(uVar45 >> 1) & 1);
        local_58a0._4_4_ = (uint)bVar34 * auVar49._4_4_ | (uint)!bVar34 * -0x800000;
        bVar34 = (bool)((byte)(uVar45 >> 2) & 1);
        local_58a0._8_4_ = (uint)bVar34 * auVar49._8_4_ | (uint)!bVar34 * -0x800000;
        bVar34 = (bool)((byte)(uVar45 >> 3) & 1);
        local_58a0._12_4_ = (uint)bVar34 * auVar49._12_4_ | (uint)!bVar34 * -0x800000;
        bVar34 = (bool)((byte)(uVar45 >> 4) & 1);
        local_58a0._16_4_ = (uint)bVar34 * auVar49._16_4_ | (uint)!bVar34 * -0x800000;
        bVar34 = (bool)((byte)(uVar45 >> 5) & 1);
        local_58a0._20_4_ = (uint)bVar34 * auVar49._20_4_ | (uint)!bVar34 * -0x800000;
        bVar34 = (bool)((byte)(uVar45 >> 6) & 1);
        local_58a0._24_4_ = (uint)bVar34 * auVar49._24_4_ | (uint)!bVar34 * -0x800000;
        bVar34 = SUB81(uVar45 >> 7,0);
        local_58a0._28_4_ = (uint)bVar34 * auVar49._28_4_ | (uint)!bVar34 * -0x800000;
        local_5e24 = (uint)(byte)~bVar33;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar41 = 7;
        }
        else {
          uVar41 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5dc0 = ray + 0x100;
        puVar42 = local_5800;
        pauVar38 = (undefined1 (*) [32])local_4640;
        local_5810 = 0xfffffffffffffff8;
        local_4660 = local_58c0;
        uStack_465c = uStack_58bc;
        uStack_4658 = uStack_58b8;
        uStack_4654 = uStack_58b4;
        uStack_4650 = uStack_58b0;
        uStack_464c = uStack_58ac;
        uStack_4648 = uStack_58a8;
        uStack_4644 = uStack_58a4;
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar91 = ZEXT3264(auVar49);
        auVar46 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        auVar92 = ZEXT1664(auVar46);
        local_5da8 = This;
LAB_01dd304a:
        do {
          do {
            root.ptr = puVar42[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd3a96;
            puVar42 = puVar42 + -1;
            pauVar38 = pauVar38 + -1;
            auVar49 = *pauVar38;
            auVar77 = ZEXT3264(auVar49);
            uVar45 = vcmpps_avx512vl(auVar49,local_58a0,1);
          } while ((char)uVar45 == '\0');
          uVar44 = (undefined4)uVar45;
          if (uVar41 < (uint)POPCOUNT(uVar44)) {
LAB_01dd308a:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd3a96;
                uVar13 = vcmpps_avx512vl(auVar77._0_32_,local_58a0,9);
                if ((char)uVar13 == '\0') goto LAB_01dd304a;
                local_5da0 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar35 = (uint)(byte)~(byte)local_5e24;
                lVar36 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                lVar37 = 0;
                goto LAB_01dd324d;
              }
              uVar45 = 8;
              auVar49 = auVar90._0_32_;
              for (lVar36 = 0;
                  (auVar77 = ZEXT3264(auVar49), lVar36 != 8 &&
                  (uVar40 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar36 * 8), uVar40 != 8));
                  lVar36 = lVar36 + 1) {
                auVar29._4_4_ = fStack_597c;
                auVar29._0_4_ = local_5980;
                auVar29._8_4_ = fStack_5978;
                auVar29._12_4_ = fStack_5974;
                auVar29._16_4_ = fStack_5970;
                auVar29._20_4_ = fStack_596c;
                auVar29._24_4_ = fStack_5968;
                auVar29._28_4_ = uStack_5964;
                uVar44 = *(undefined4 *)(root.ptr + 0x40 + lVar36 * 4);
                auVar68._4_4_ = uVar44;
                auVar68._0_4_ = uVar44;
                auVar68._8_4_ = uVar44;
                auVar68._12_4_ = uVar44;
                auVar68._16_4_ = uVar44;
                auVar68._20_4_ = uVar44;
                auVar68._24_4_ = uVar44;
                auVar68._28_4_ = uVar44;
                auVar46 = vfmsub132ps_fma(auVar68,auVar29,local_59e0);
                auVar30._4_4_ = fStack_595c;
                auVar30._0_4_ = local_5960;
                auVar30._8_4_ = fStack_5958;
                auVar30._12_4_ = fStack_5954;
                auVar30._16_4_ = fStack_5950;
                auVar30._20_4_ = fStack_594c;
                auVar30._24_4_ = fStack_5948;
                auVar30._28_4_ = uStack_5944;
                uVar44 = *(undefined4 *)(root.ptr + 0x80 + lVar36 * 4);
                auVar73._4_4_ = uVar44;
                auVar73._0_4_ = uVar44;
                auVar73._8_4_ = uVar44;
                auVar73._12_4_ = uVar44;
                auVar73._16_4_ = uVar44;
                auVar73._20_4_ = uVar44;
                auVar73._24_4_ = uVar44;
                auVar73._28_4_ = uVar44;
                uVar44 = *(undefined4 *)(root.ptr + 0xc0 + lVar36 * 4);
                auVar76._4_4_ = uVar44;
                auVar76._0_4_ = uVar44;
                auVar76._8_4_ = uVar44;
                auVar76._12_4_ = uVar44;
                auVar76._16_4_ = uVar44;
                auVar76._20_4_ = uVar44;
                auVar76._24_4_ = uVar44;
                auVar76._28_4_ = uVar44;
                auVar18 = vfmsub132ps_fma(auVar73,auVar30,local_59c0);
                auVar19 = vfmsub132ps_fma(auVar76,local_5940,local_59a0);
                uVar44 = *(undefined4 *)(root.ptr + 0x60 + lVar36 * 4);
                auVar21._4_4_ = uVar44;
                auVar21._0_4_ = uVar44;
                auVar21._8_4_ = uVar44;
                auVar21._12_4_ = uVar44;
                auVar21._16_4_ = uVar44;
                auVar21._20_4_ = uVar44;
                auVar21._24_4_ = uVar44;
                auVar21._28_4_ = uVar44;
                auVar47 = vfmsub132ps_avx512vl(local_59e0,auVar29,auVar21);
                uVar44 = *(undefined4 *)(root.ptr + 0xa0 + lVar36 * 4);
                auVar22._4_4_ = uVar44;
                auVar22._0_4_ = uVar44;
                auVar22._8_4_ = uVar44;
                auVar22._12_4_ = uVar44;
                auVar22._16_4_ = uVar44;
                auVar22._20_4_ = uVar44;
                auVar22._24_4_ = uVar44;
                auVar22._28_4_ = uVar44;
                auVar50 = vfmsub132ps_avx512vl(local_59c0,auVar30,auVar22);
                uVar44 = *(undefined4 *)(root.ptr + 0xe0 + lVar36 * 4);
                auVar23._4_4_ = uVar44;
                auVar23._0_4_ = uVar44;
                auVar23._8_4_ = uVar44;
                auVar23._12_4_ = uVar44;
                auVar23._16_4_ = uVar44;
                auVar23._20_4_ = uVar44;
                auVar23._24_4_ = uVar44;
                auVar23._28_4_ = uVar44;
                auVar51 = vfmsub132ps_avx512vl(local_59a0,local_5940,auVar23);
                auVar48 = vpminsd_avx2(ZEXT1632(auVar46),auVar47);
                auVar52 = vpminsd_avx2(ZEXT1632(auVar18),auVar50);
                auVar48 = vpmaxsd_avx2(auVar48,auVar52);
                auVar52 = vpminsd_avx2(ZEXT1632(auVar19),auVar51);
                auVar48 = vpmaxsd_avx2(auVar48,auVar52);
                auVar52 = vpmaxsd_avx2(ZEXT1632(auVar46),auVar47);
                auVar47 = vpmaxsd_avx2(ZEXT1632(auVar18),auVar50);
                auVar47 = vpminsd_avx2(auVar52,auVar47);
                auVar52 = vpmaxsd_avx2(ZEXT1632(auVar19),auVar51);
                auVar47 = vpminsd_avx2(auVar47,auVar52);
                auVar31._4_4_ = uStack_58bc;
                auVar31._0_4_ = local_58c0;
                auVar31._8_4_ = uStack_58b8;
                auVar31._12_4_ = uStack_58b4;
                auVar31._16_4_ = uStack_58b0;
                auVar31._20_4_ = uStack_58ac;
                auVar31._24_4_ = uStack_58a8;
                auVar31._28_4_ = uStack_58a4;
                auVar52 = vpmaxsd_avx2(auVar48,auVar31);
                auVar47 = vpminsd_avx2(auVar47,local_58a0);
                uVar15 = vpcmpd_avx512vl(auVar52,auVar47,2);
                uVar39 = uVar45;
                auVar53 = auVar49;
                if ((byte)uVar15 != 0) {
                  auVar52 = vblendmps_avx512vl(auVar90._0_32_,auVar48);
                  bVar34 = (bool)((byte)uVar15 & 1);
                  auVar53._0_4_ = (uint)bVar34 * auVar52._0_4_ | (uint)!bVar34 * auVar48._0_4_;
                  bVar34 = (bool)((byte)(uVar15 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar34 * auVar52._4_4_ | (uint)!bVar34 * auVar48._4_4_;
                  bVar34 = (bool)((byte)(uVar15 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar34 * auVar52._8_4_ | (uint)!bVar34 * auVar48._8_4_;
                  bVar34 = (bool)((byte)(uVar15 >> 3) & 1);
                  auVar53._12_4_ = (uint)bVar34 * auVar52._12_4_ | (uint)!bVar34 * auVar48._12_4_;
                  bVar34 = (bool)((byte)(uVar15 >> 4) & 1);
                  auVar53._16_4_ = (uint)bVar34 * auVar52._16_4_ | (uint)!bVar34 * auVar48._16_4_;
                  bVar34 = (bool)((byte)(uVar15 >> 5) & 1);
                  auVar53._20_4_ = (uint)bVar34 * auVar52._20_4_ | (uint)!bVar34 * auVar48._20_4_;
                  bVar34 = (bool)((byte)(uVar15 >> 6) & 1);
                  auVar53._24_4_ = (uint)bVar34 * auVar52._24_4_ | (uint)!bVar34 * auVar48._24_4_;
                  bVar34 = SUB81(uVar15 >> 7,0);
                  auVar53._28_4_ = (uint)bVar34 * auVar52._28_4_ | (uint)!bVar34 * auVar48._28_4_;
                  uVar39 = uVar40;
                  if (uVar45 != 8) {
                    *puVar42 = uVar45;
                    puVar42 = puVar42 + 1;
                    *pauVar38 = auVar49;
                    pauVar38 = pauVar38 + 1;
                  }
                }
                auVar49 = auVar53;
                uVar45 = uVar39;
              }
              if (uVar45 == 8) goto LAB_01dd31f0;
              uVar13 = vcmpps_avx512vl(auVar49,local_58a0,9);
              root.ptr = uVar45;
            } while ((byte)uVar41 < (byte)POPCOUNT((int)uVar13));
            *puVar42 = uVar45;
            puVar42 = puVar42 + 1;
            *pauVar38 = auVar49;
            pauVar38 = pauVar38 + 1;
LAB_01dd31f0:
            iVar83 = 4;
          }
          else {
            while( true ) {
              local_5d60 = auVar49;
              auVar46 = auVar92._0_16_;
              bVar33 = (byte)local_5e24;
              if (uVar45 == 0) break;
              k = 0;
              for (uVar40 = uVar45; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              uVar45 = uVar45 - 1 & uVar45;
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar34 = occluded1(local_5da8,local_5db0,root,k,&local_5dfd,ray,
                                 (TravRayK<8,_false> *)&local_5aa0.field_0,context);
              auVar46 = vxorps_avx512vl(auVar46,auVar46);
              auVar92 = ZEXT1664(auVar46);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar91 = ZEXT3264(auVar49);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar90 = ZEXT3264(auVar49);
              bVar32 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar34) {
                bVar32 = 0;
              }
              local_5e24 = (uint)(bVar33 | bVar32);
              auVar49 = local_5d60;
            }
            iVar83 = 3;
            auVar77 = ZEXT3264(local_5d60);
            if (bVar33 != 0xff) {
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_58a0._0_4_ =
                   (uint)(bVar33 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar33 & 1) * local_58a0._0_4_
              ;
              bVar34 = (bool)((byte)(local_5e24 >> 1) & 1);
              local_58a0._4_4_ = (uint)bVar34 * auVar49._4_4_ | (uint)!bVar34 * local_58a0._4_4_;
              bVar34 = (bool)((byte)(local_5e24 >> 2) & 1);
              local_58a0._8_4_ = (uint)bVar34 * auVar49._8_4_ | (uint)!bVar34 * local_58a0._8_4_;
              bVar34 = (bool)((byte)(local_5e24 >> 3) & 1);
              local_58a0._12_4_ = (uint)bVar34 * auVar49._12_4_ | (uint)!bVar34 * local_58a0._12_4_;
              bVar34 = (bool)((byte)(local_5e24 >> 4) & 1);
              local_58a0._16_4_ = (uint)bVar34 * auVar49._16_4_ | (uint)!bVar34 * local_58a0._16_4_;
              bVar34 = (bool)((byte)(local_5e24 >> 5) & 1);
              local_58a0._20_4_ = (uint)bVar34 * auVar49._20_4_ | (uint)!bVar34 * local_58a0._20_4_;
              bVar34 = (bool)((byte)(local_5e24 >> 6) & 1);
              local_58a0._24_4_ = (uint)bVar34 * auVar49._24_4_ | (uint)!bVar34 * local_58a0._24_4_;
              local_58a0._28_4_ =
                   (local_5e24 >> 7) * auVar49._28_4_ |
                   (uint)!SUB41(local_5e24 >> 7,0) * local_58a0._28_4_;
              iVar83 = 2;
            }
            if (uVar41 < (uint)POPCOUNT(uVar44)) goto LAB_01dd308a;
          }
        } while ((iVar83 == 4) || (iVar83 == 2));
LAB_01dd3a96:
        local_5dfc._0_1_ = (byte)local_5e24 & (byte)local_5dfc;
        bVar34 = (bool)((byte)local_5dfc >> 1 & 1);
        bVar4 = (bool)((byte)local_5dfc >> 2 & 1);
        bVar5 = (bool)((byte)local_5dfc >> 3 & 1);
        bVar6 = (bool)((byte)local_5dfc >> 4 & 1);
        bVar7 = (bool)((byte)local_5dfc >> 5 & 1);
        bVar8 = (bool)((byte)local_5dfc >> 6 & 1);
        *(uint *)local_5dc0 =
             (uint)((byte)local_5dfc & 1) * -0x800000 |
             (uint)!(bool)((byte)local_5dfc & 1) * *(int *)local_5dc0;
        *(uint *)(local_5dc0 + 4) =
             (uint)bVar34 * -0x800000 | (uint)!bVar34 * *(int *)(local_5dc0 + 4);
        *(uint *)(local_5dc0 + 8) =
             (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(local_5dc0 + 8);
        *(uint *)(local_5dc0 + 0xc) =
             (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_5dc0 + 0xc);
        *(uint *)(local_5dc0 + 0x10) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5dc0 + 0x10);
        *(uint *)(local_5dc0 + 0x14) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5dc0 + 0x14);
        *(uint *)(local_5dc0 + 0x18) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5dc0 + 0x18);
        *(uint *)(local_5dc0 + 0x1c) =
             (uint)((byte)local_5dfc >> 7) * -0x800000 |
             (uint)!(bool)((byte)local_5dfc >> 7) * *(int *)(local_5dc0 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01dd324d:
  do {
    if (lVar37 == local_5da0) goto LAB_01dd3968;
    local_5d88 = lVar37 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_5d90 = context->scene;
    lVar43 = 0;
    local_5d60._0_8_ = lVar36;
    local_5df8 = uVar35;
    local_5d98 = lVar37;
    do {
      bVar33 = (byte)uVar35;
      if ((lVar43 == 4) || (*(int *)(lVar36 + lVar43 * 4) == -1)) goto LAB_01dd394a;
      pfVar1 = (local_5d90->vertices).items[*(uint *)(lVar36 + -0x10 + lVar43 * 4)];
      uVar45 = (ulong)*(uint *)(lVar36 + -0x40 + lVar43 * 4);
      fVar60 = pfVar1[uVar45];
      auVar66._4_4_ = fVar60;
      auVar66._0_4_ = fVar60;
      auVar66._8_4_ = fVar60;
      auVar66._12_4_ = fVar60;
      auVar66._16_4_ = fVar60;
      auVar66._20_4_ = fVar60;
      auVar66._24_4_ = fVar60;
      auVar66._28_4_ = fVar60;
      uVar40 = (ulong)*(uint *)(lVar36 + -0x30 + lVar43 * 4);
      fVar62 = pfVar1[uVar45 + 1];
      auVar71._4_4_ = fVar62;
      auVar71._0_4_ = fVar62;
      auVar71._8_4_ = fVar62;
      auVar71._12_4_ = fVar62;
      auVar71._16_4_ = fVar62;
      auVar71._20_4_ = fVar62;
      auVar71._24_4_ = fVar62;
      auVar71._28_4_ = fVar62;
      fVar63 = pfVar1[uVar45 + 2];
      auVar74._4_4_ = fVar63;
      auVar74._0_4_ = fVar63;
      auVar74._8_4_ = fVar63;
      auVar74._12_4_ = fVar63;
      auVar74._16_4_ = fVar63;
      auVar74._20_4_ = fVar63;
      auVar74._24_4_ = fVar63;
      auVar74._28_4_ = fVar63;
      uVar45 = (ulong)*(uint *)(lVar36 + -0x20 + lVar43 * 4);
      fVar11 = fVar60 - pfVar1[uVar40];
      fVar64 = fVar62 - pfVar1[uVar40 + 1];
      fVar12 = fVar63 - pfVar1[uVar40 + 2];
      local_5d10 = *(undefined8 *)(local_5d88 + 0x30);
      uStack_5d08 = *(undefined8 *)(local_5d88 + 0x38);
      local_5d20 = *(undefined8 *)(local_5d88 + 0x40);
      uStack_5d18 = *(undefined8 *)(local_5d88 + 0x48);
      auVar69._4_4_ = fVar11;
      auVar69._0_4_ = fVar11;
      auVar69._8_4_ = fVar11;
      auVar69._12_4_ = fVar11;
      auVar69._16_4_ = fVar11;
      auVar69._20_4_ = fVar11;
      auVar69._24_4_ = fVar11;
      auVar69._28_4_ = fVar11;
      auVar75._4_4_ = fVar64;
      auVar75._0_4_ = fVar64;
      auVar75._8_4_ = fVar64;
      auVar75._12_4_ = fVar64;
      auVar75._16_4_ = fVar64;
      auVar75._20_4_ = fVar64;
      auVar75._24_4_ = fVar64;
      auVar75._28_4_ = fVar64;
      auVar78._4_4_ = fVar12;
      auVar78._0_4_ = fVar12;
      auVar78._8_4_ = fVar12;
      auVar78._12_4_ = fVar12;
      auVar78._16_4_ = fVar12;
      auVar78._20_4_ = fVar12;
      auVar78._24_4_ = fVar12;
      auVar78._28_4_ = fVar12;
      fVar60 = pfVar1[uVar45] - fVar60;
      auVar89._4_4_ = fVar60;
      auVar89._0_4_ = fVar60;
      auVar89._8_4_ = fVar60;
      auVar89._12_4_ = fVar60;
      auVar89._16_4_ = fVar60;
      auVar89._20_4_ = fVar60;
      auVar89._24_4_ = fVar60;
      auVar89._28_4_ = fVar60;
      auVar54 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar1[uVar45 + 1] - fVar62)));
      auVar55 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar1[uVar45 + 2] - fVar63)));
      fVar64 = fVar64 * (pfVar1[uVar45 + 2] - fVar63);
      auVar56._4_4_ = fVar64;
      auVar56._0_4_ = fVar64;
      auVar56._8_4_ = fVar64;
      auVar56._12_4_ = fVar64;
      auVar56._16_4_ = fVar64;
      auVar56._20_4_ = fVar64;
      auVar56._24_4_ = fVar64;
      auVar56._28_4_ = fVar64;
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar54,auVar78);
      fVar60 = fVar12 * fVar60;
      auVar61._4_4_ = fVar60;
      auVar61._0_4_ = fVar60;
      auVar61._8_4_ = fVar60;
      auVar61._12_4_ = fVar60;
      auVar61._16_4_ = fVar60;
      auVar61._20_4_ = fVar60;
      auVar61._24_4_ = fVar60;
      auVar61._28_4_ = fVar60;
      aiVar57 = (int  [8])vfmsub231ps_avx512vl(auVar61,auVar55,auVar69);
      fVar11 = fVar11 * (pfVar1[uVar45 + 1] - fVar62);
      auVar65._4_4_ = fVar11;
      auVar65._0_4_ = fVar11;
      auVar65._8_4_ = fVar11;
      auVar65._12_4_ = fVar11;
      auVar65._16_4_ = fVar11;
      auVar65._20_4_ = fVar11;
      auVar65._24_4_ = fVar11;
      auVar65._28_4_ = fVar11;
      auVar19 = vfmsub231ps_fma(auVar65,auVar89,auVar75);
      auVar47 = vsubps_avx(auVar66,*(undefined1 (*) [32])ray);
      auVar50 = vsubps_avx(auVar71,*(undefined1 (*) [32])(ray + 0x20));
      auVar51 = vsubps_avx(auVar74,*(undefined1 (*) [32])(ray + 0x40));
      auVar49 = *(undefined1 (*) [32])(ray + 0x80);
      auVar48 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar52 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar87._0_4_ = auVar48._0_4_ * auVar51._0_4_;
      auVar87._4_4_ = auVar48._4_4_ * auVar51._4_4_;
      auVar87._8_4_ = auVar48._8_4_ * auVar51._8_4_;
      auVar87._12_4_ = auVar48._12_4_ * auVar51._12_4_;
      auVar87._16_4_ = auVar48._16_4_ * auVar51._16_4_;
      auVar87._20_4_ = auVar48._20_4_ * auVar51._20_4_;
      auVar87._24_4_ = auVar48._24_4_ * auVar51._24_4_;
      auVar87._28_4_ = 0;
      auVar20 = vfmsub231ps_fma(auVar87,auVar50,auVar52);
      auVar88._0_4_ = auVar52._0_4_ * auVar47._0_4_;
      auVar88._4_4_ = auVar52._4_4_ * auVar47._4_4_;
      auVar88._8_4_ = auVar52._8_4_ * auVar47._8_4_;
      auVar88._12_4_ = auVar52._12_4_ * auVar47._12_4_;
      auVar88._16_4_ = auVar52._16_4_ * auVar47._16_4_;
      auVar88._20_4_ = auVar52._20_4_ * auVar47._20_4_;
      auVar88._24_4_ = auVar52._24_4_ * auVar47._24_4_;
      auVar88._28_4_ = 0;
      auVar16 = vfmsub231ps_fma(auVar88,auVar51,auVar49);
      auVar77._0_4_ = auVar49._0_4_ * auVar50._0_4_;
      auVar77._4_4_ = auVar49._4_4_ * auVar50._4_4_;
      auVar77._8_4_ = auVar49._8_4_ * auVar50._8_4_;
      auVar77._12_4_ = auVar49._12_4_ * auVar50._12_4_;
      auVar77._16_4_ = auVar49._16_4_ * auVar50._16_4_;
      auVar77._20_4_ = auVar49._20_4_ * auVar50._20_4_;
      auVar77._28_36_ = in_ZMM14._28_36_;
      auVar77._24_4_ = auVar49._24_4_ * auVar50._24_4_;
      auVar17 = vfmsub231ps_fma(auVar77._0_32_,auVar47,auVar48);
      in_ZMM14 = ZEXT1664(auVar17);
      auVar26._4_4_ = auVar19._4_4_ * auVar52._4_4_;
      auVar26._0_4_ = auVar19._0_4_ * auVar52._0_4_;
      auVar26._8_4_ = auVar19._8_4_ * auVar52._8_4_;
      auVar26._12_4_ = auVar19._12_4_ * auVar52._12_4_;
      auVar26._16_4_ = auVar52._16_4_ * 0.0;
      auVar26._20_4_ = auVar52._20_4_ * 0.0;
      auVar26._24_4_ = auVar52._24_4_ * 0.0;
      auVar26._28_4_ = auVar52._28_4_;
      auVar46 = vfmadd231ps_fma(auVar26,(undefined1  [32])aiVar57,auVar48);
      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar56,auVar49);
      vandps_avx512vl(ZEXT1632(auVar46),auVar91._0_32_);
      auVar49 = vmulps_avx512vl(auVar55,ZEXT1632(auVar17));
      auVar49 = vfmadd231ps_avx512vl(auVar49,ZEXT1632(auVar16),auVar54);
      auVar18 = vfmadd231ps_fma(auVar49,ZEXT1632(auVar20),auVar89);
      uVar79 = aiVar57[0];
      auVar54._0_4_ = uVar79 ^ auVar18._0_4_;
      uVar80 = aiVar57[1];
      auVar54._4_4_ = uVar80 ^ auVar18._4_4_;
      uVar81 = aiVar57[2];
      auVar54._8_4_ = uVar81 ^ auVar18._8_4_;
      uVar82 = aiVar57[3];
      auVar54._12_4_ = uVar82 ^ auVar18._12_4_;
      iVar83 = aiVar57[4];
      auVar54._16_4_ = iVar83;
      iVar84 = aiVar57[5];
      auVar54._20_4_ = iVar84;
      iVar85 = aiVar57[6];
      auVar54._24_4_ = iVar85;
      iVar86 = aiVar57[7];
      auVar54._28_4_ = iVar86;
      uVar13 = vcmpps_avx512vl(auVar54,auVar92._0_32_,5);
      bVar32 = (byte)uVar13 & bVar33;
      if (bVar32 == 0) {
LAB_01dd3406:
        bVar32 = 0;
      }
      else {
        auVar55._4_4_ = fVar12 * auVar17._4_4_;
        auVar55._0_4_ = fVar12 * auVar17._0_4_;
        auVar55._8_4_ = fVar12 * auVar17._8_4_;
        auVar55._12_4_ = fVar12 * auVar17._12_4_;
        auVar55._16_4_ = fVar12 * 0.0;
        auVar55._20_4_ = fVar12 * 0.0;
        auVar55._24_4_ = fVar12 * 0.0;
        auVar55._28_4_ = fVar12;
        auVar18 = vfmadd213ps_fma(ZEXT1632(auVar16),auVar75,auVar55);
        auVar18 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar69,ZEXT1632(auVar18));
        auVar70._0_4_ = uVar79 ^ auVar18._0_4_;
        auVar70._4_4_ = uVar80 ^ auVar18._4_4_;
        auVar70._8_4_ = uVar81 ^ auVar18._8_4_;
        auVar70._12_4_ = uVar82 ^ auVar18._12_4_;
        auVar70._16_4_ = iVar83;
        auVar70._20_4_ = iVar84;
        auVar70._24_4_ = iVar85;
        auVar70._28_4_ = iVar86;
        uVar13 = vcmpps_avx512vl(auVar70,auVar92._0_32_,5);
        bVar32 = bVar32 & (byte)uVar13;
        if (bVar32 == 0) goto LAB_01dd3406;
        auVar25._8_4_ = 0x7fffffff;
        auVar25._0_8_ = 0x7fffffff7fffffff;
        auVar25._12_4_ = 0x7fffffff;
        auVar25._16_4_ = 0x7fffffff;
        auVar25._20_4_ = 0x7fffffff;
        auVar25._24_4_ = 0x7fffffff;
        auVar25._28_4_ = 0x7fffffff;
        vandps_avx512vl(ZEXT1632(auVar46),auVar25);
        auVar48 = vsubps_avx(auVar49,auVar54);
        uVar13 = vcmpps_avx512vl(auVar48,auVar70,5);
        bVar32 = bVar32 & (byte)uVar13;
        if (bVar32 == 0) goto LAB_01dd3406;
        auVar27._4_4_ = auVar51._4_4_ * auVar19._4_4_;
        auVar27._0_4_ = auVar51._0_4_ * auVar19._0_4_;
        auVar27._8_4_ = auVar51._8_4_ * auVar19._8_4_;
        auVar27._12_4_ = auVar51._12_4_ * auVar19._12_4_;
        auVar27._16_4_ = auVar51._16_4_ * 0.0;
        auVar27._20_4_ = auVar51._20_4_ * 0.0;
        auVar27._24_4_ = auVar51._24_4_ * 0.0;
        auVar27._28_4_ = auVar51._28_4_;
        auVar18 = vfmadd213ps_fma(auVar50,(undefined1  [32])aiVar57,auVar27);
        auVar18 = vfmadd213ps_fma(auVar47,auVar56,ZEXT1632(auVar18));
        auVar72._0_4_ = auVar49._0_4_ * *(float *)(ray + 0x60);
        auVar72._4_4_ = auVar49._4_4_ * *(float *)(ray + 100);
        auVar72._8_4_ = auVar49._8_4_ * *(float *)(ray + 0x68);
        auVar72._12_4_ = auVar49._12_4_ * *(float *)(ray + 0x6c);
        auVar72._16_4_ = auVar49._16_4_ * *(float *)(ray + 0x70);
        auVar72._20_4_ = auVar49._20_4_ * *(float *)(ray + 0x74);
        auVar72._24_4_ = auVar49._24_4_ * *(float *)(ray + 0x78);
        auVar72._28_4_ = 0;
        auVar67._0_4_ = uVar79 ^ auVar18._0_4_;
        auVar67._4_4_ = uVar80 ^ auVar18._4_4_;
        auVar67._8_4_ = uVar81 ^ auVar18._8_4_;
        auVar67._12_4_ = uVar82 ^ auVar18._12_4_;
        auVar67._16_4_ = iVar83;
        auVar67._20_4_ = iVar84;
        auVar67._24_4_ = iVar85;
        auVar67._28_4_ = iVar86;
        auVar28._4_4_ = auVar49._4_4_ * *(float *)(ray + 0x104);
        auVar28._0_4_ = auVar49._0_4_ * *(float *)(ray + 0x100);
        auVar28._8_4_ = auVar49._8_4_ * *(float *)(ray + 0x108);
        auVar28._12_4_ = auVar49._12_4_ * *(float *)(ray + 0x10c);
        auVar28._16_4_ = auVar49._16_4_ * *(float *)(ray + 0x110);
        auVar28._20_4_ = auVar49._20_4_ * *(float *)(ray + 0x114);
        auVar28._24_4_ = auVar49._24_4_ * *(float *)(ray + 0x118);
        auVar28._28_4_ = auVar51._28_4_;
        uVar13 = vcmpps_avx512vl(auVar67,auVar28,2);
        uVar14 = vcmpps_avx512vl(auVar72,auVar67,1);
        bVar32 = bVar32 & (byte)uVar13 & (byte)uVar14;
        if (bVar32 == 0) {
LAB_01dd3941:
          bVar32 = 0;
        }
        else {
          uVar13 = vcmpps_avx512vl(ZEXT1632(auVar46),ZEXT832(0) << 0x20,4);
          bVar32 = bVar32 & (byte)uVar13;
          if (bVar32 == 0) goto LAB_01dd3941;
          _local_5c40 = auVar54;
          _local_5c60 = auVar70;
          _local_5c80 = auVar67;
          local_5ca0 = auVar49;
          local_5cc0 = auVar56;
          local_5ce0.i[0] = aiVar57[0];
          local_5ce0.i[1] = aiVar57[1];
          local_5ce0.i[2] = aiVar57[2];
          local_5ce0.i[3] = aiVar57[3];
          local_5ce0.i[4] = aiVar57[4];
          local_5ce0.i[5] = aiVar57[5];
          local_5ce0.i[6] = aiVar57[6];
          local_5ce0.i[7] = aiVar57[7];
          local_5d00 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar19);
        }
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar90 = ZEXT3264(auVar49);
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar91 = ZEXT3264(auVar49);
        auVar46 = vxorps_avx512vl(auVar92._0_16_,auVar92._0_16_);
        auVar92 = ZEXT1664(auVar46);
      }
      auVar46 = auVar92._0_16_;
      uVar45 = CONCAT44(0,*(uint *)((long)&local_5d10 + lVar43 * 4));
      local_5d80._0_8_ = uVar45;
      pGVar2 = (context->scene->geometries).items[uVar45].ptr;
      uVar79 = pGVar2->mask;
      auVar59._4_4_ = uVar79;
      auVar59._0_4_ = uVar79;
      auVar59._8_4_ = uVar79;
      auVar59._12_4_ = uVar79;
      auVar59._16_4_ = uVar79;
      auVar59._20_4_ = uVar79;
      auVar59._24_4_ = uVar79;
      auVar59._28_4_ = uVar79;
      uVar13 = vptestmd_avx512vl(auVar59,*(undefined1 (*) [32])(ray + 0x120));
      bVar32 = (byte)uVar13 & bVar32;
      if (bVar32 != 0) {
        local_5df4 = *(undefined4 *)((long)&local_5d20 + lVar43 * 4);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar49 = vrcp14ps_avx512vl(local_5ca0);
          auVar24._8_4_ = 0x3f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          auVar24._12_4_ = 0x3f800000;
          auVar24._16_4_ = 0x3f800000;
          auVar24._20_4_ = 0x3f800000;
          auVar24._24_4_ = 0x3f800000;
          auVar24._28_4_ = 0x3f800000;
          auVar48 = vfnmadd213ps_avx512vl(auVar49,local_5ca0,auVar24);
          auVar18 = vfmadd132ps_fma(auVar48,auVar49,auVar49);
          fVar60 = auVar18._0_4_;
          fVar62 = auVar18._4_4_;
          fVar63 = auVar18._8_4_;
          fVar64 = auVar18._12_4_;
          local_5ba0._0_4_ = fVar60 * (float)local_5c60._0_4_;
          local_5ba0._4_4_ = fVar62 * (float)local_5c60._4_4_;
          local_5ba0._8_4_ = fVar63 * fStack_5c58;
          local_5ba0._12_4_ = fVar64 * fStack_5c54;
          local_5ba0._16_4_ = fStack_5c50 * 0.0;
          local_5ba0._20_4_ = fStack_5c4c * 0.0;
          local_5ba0._24_4_ = fStack_5c48 * 0.0;
          local_5ba0._28_4_ = 0;
          local_5c20._0_8_ = local_5cc0._0_8_;
          local_5c20._8_8_ = local_5cc0._8_8_;
          local_5c20._16_8_ = local_5cc0._16_8_;
          local_5c20._24_8_ = local_5cc0._24_8_;
          local_5c20.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5ce0;
          local_5c20.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5d00;
          local_5bc0 = CONCAT44(fVar62 * (float)local_5c80._4_4_,fVar60 * (float)local_5c80._0_4_);
          uStack_5bb8 = CONCAT44(fVar64 * fStack_5c74,fVar63 * fStack_5c78);
          uStack_5bb0 = CONCAT44(fStack_5c6c * 0.0,fStack_5c70 * 0.0);
          uStack_5ba8 = CONCAT44(auVar49._28_4_,fStack_5c68 * 0.0);
          local_5b80._4_4_ = fVar62 * (float)local_5c40._4_4_;
          local_5b80._0_4_ = fVar60 * (float)local_5c40._0_4_;
          fStack_5b78 = fVar63 * fStack_5c38;
          fStack_5b74 = fVar64 * fStack_5c34;
          fStack_5b70 = fStack_5c30 * 0.0;
          fStack_5b6c = fStack_5c2c * 0.0;
          fStack_5b68 = fStack_5c28 * 0.0;
          uStack_5b64 = local_5ca0._28_4_;
          local_5df0.valid = (int *)&local_5880;
          local_5df0.geometryUserPtr = &local_5b00;
          local_5df0.context = local_5ae0;
          local_5df0.ray = (RTCRayN *)&local_5ac0;
          in_ZMM14 = ZEXT1664(auVar17);
          local_5db8 = pGVar2;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_5df0,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_5c20.field_0);
          local_5b60 = vpbroadcastd_avx512vl();
          _local_5b80 = vpbroadcastd_avx512vl();
          local_5c20._0_8_ = local_5880;
          local_5c20._8_8_ = uStack_5878;
          local_5c20._16_8_ = uStack_5870;
          local_5c20._24_8_ = uStack_5868;
          local_5c20.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5860;
          local_5c20.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5840;
          local_5bc0 = local_5ac0._0_8_;
          uStack_5bb8 = local_5ac0._8_8_;
          uStack_5bb0 = local_5ac0._16_8_;
          uStack_5ba8 = local_5ac0._24_8_;
          vpcmpeqd_avx2(local_5b60,local_5b60);
          uStack_5b3c = context->user->instID[0];
          local_5b40 = uStack_5b3c;
          uStack_5b38 = uStack_5b3c;
          uStack_5b34 = uStack_5b3c;
          uStack_5b30 = uStack_5b3c;
          uStack_5b2c = uStack_5b3c;
          uStack_5b28 = uStack_5b3c;
          uStack_5b24 = uStack_5b3c;
          uStack_5b1c = context->user->instPrimID[0];
          local_5b20 = uStack_5b1c;
          uStack_5b18 = uStack_5b1c;
          uStack_5b14 = uStack_5b1c;
          uStack_5b10 = uStack_5b1c;
          uStack_5b0c = uStack_5b1c;
          uStack_5b08 = uStack_5b1c;
          uStack_5b04 = uStack_5b1c;
          local_5d80 = *(undefined1 (*) [32])(ray + 0x100);
          auVar49 = vblendmps_avx512vl(local_5d80,(undefined1  [32])local_5b00);
          bVar34 = (bool)(bVar32 >> 1 & 1);
          bVar4 = (bool)(bVar32 >> 2 & 1);
          bVar5 = (bool)(bVar32 >> 3 & 1);
          bVar6 = (bool)(bVar32 >> 4 & 1);
          bVar7 = (bool)(bVar32 >> 5 & 1);
          bVar8 = (bool)(bVar32 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar32 & 1) * auVar49._0_4_ | !(bool)(bVar32 & 1) * uStack_5b1c;
          *(uint *)(ray + 0x104) = (uint)bVar34 * auVar49._4_4_ | !bVar34 * uStack_5b1c;
          *(uint *)(ray + 0x108) = (uint)bVar4 * auVar49._8_4_ | !bVar4 * uStack_5b1c;
          *(uint *)(ray + 0x10c) = (uint)bVar5 * auVar49._12_4_ | !bVar5 * uStack_5b1c;
          *(uint *)(ray + 0x110) = (uint)bVar6 * auVar49._16_4_ | !bVar6 * uStack_5b1c;
          *(uint *)(ray + 0x114) = (uint)bVar7 * auVar49._20_4_ | !bVar7 * uStack_5b1c;
          *(uint *)(ray + 0x118) = (uint)bVar8 * auVar49._24_4_ | !bVar8 * uStack_5b1c;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar32 >> 7) * auVar49._28_4_ | !(bool)(bVar32 >> 7) * uStack_5b1c;
          local_5d40 = vpmovm2d_avx512vl((ulong)bVar32);
          local_5df0.valid = (int *)local_5d40;
          local_5df0.geometryUserPtr = local_5db8->userPtr;
          local_5df0.context = context->user;
          local_5df0.hit = (RTCHitN *)&local_5c20;
          local_5df0.N = 8;
          local_5df0.ray = (RTCRayN *)ray;
          if (local_5db8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            (*local_5db8->occlusionFilterN)(&local_5df0);
          }
          if (local_5d40 == (undefined1  [32])0x0) {
            uVar45 = 0;
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar90 = ZEXT3264(auVar49);
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar91 = ZEXT3264(auVar49);
            auVar46 = vxorps_avx512vl(auVar46,auVar46);
            auVar92 = ZEXT1664(auVar46);
          }
          else {
            p_Var3 = context->args->filter;
            if (p_Var3 == (RTCFilterFunctionN)0x0) {
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar90 = ZEXT3264(auVar49);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar91 = ZEXT3264(auVar49);
              auVar46 = vxorps_avx512vl(auVar46,auVar46);
              auVar92 = ZEXT1664(auVar46);
            }
            else {
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar90 = ZEXT3264(auVar49);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar91 = ZEXT3264(auVar49);
              auVar46 = vxorps_avx512vl(auVar46,auVar46);
              auVar92 = ZEXT1664(auVar46);
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((local_5db8->field_8).field_0x2 & 0x40) != 0)
                 ) {
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                (*p_Var3)(&local_5df0);
                auVar46 = vxorps_avx512vl(auVar46,auVar46);
                auVar92 = ZEXT1664(auVar46);
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar91 = ZEXT3264(auVar49);
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar90 = ZEXT3264(auVar49);
              }
            }
            uVar45 = vptestmd_avx512vl(local_5d40,local_5d40);
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar34 = (bool)((byte)uVar45 & 1);
            auVar58._0_4_ =
                 (uint)bVar34 * auVar49._0_4_ | (uint)!bVar34 * *(int *)(local_5df0.ray + 0x100);
            bVar34 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar58._4_4_ =
                 (uint)bVar34 * auVar49._4_4_ |
                 (uint)!bVar34 * *(int *)((RayK<8> *)(local_5df0.ray + 0x100) + 4);
            bVar34 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar58._8_4_ =
                 (uint)bVar34 * auVar49._8_4_ |
                 (uint)!bVar34 * *(int *)((RayK<8> *)(local_5df0.ray + 0x100) + 8);
            bVar34 = (bool)((byte)(uVar45 >> 3) & 1);
            auVar58._12_4_ =
                 (uint)bVar34 * auVar49._12_4_ |
                 (uint)!bVar34 * *(int *)((RayK<8> *)(local_5df0.ray + 0x100) + 0xc);
            bVar34 = (bool)((byte)(uVar45 >> 4) & 1);
            auVar58._16_4_ =
                 (uint)bVar34 * auVar49._16_4_ |
                 (uint)!bVar34 * *(int *)((RayK<8> *)(local_5df0.ray + 0x100) + 0x10);
            bVar34 = (bool)((byte)(uVar45 >> 5) & 1);
            auVar58._20_4_ =
                 (uint)bVar34 * auVar49._20_4_ |
                 (uint)!bVar34 * *(int *)((RayK<8> *)(local_5df0.ray + 0x100) + 0x14);
            bVar34 = (bool)((byte)(uVar45 >> 6) & 1);
            auVar58._24_4_ =
                 (uint)bVar34 * auVar49._24_4_ |
                 (uint)!bVar34 * *(int *)((RayK<8> *)(local_5df0.ray + 0x100) + 0x18);
            bVar34 = SUB81(uVar45 >> 7,0);
            auVar58._28_4_ =
                 (uint)bVar34 * auVar49._28_4_ |
                 (uint)!bVar34 * *(int *)((RayK<8> *)(local_5df0.ray + 0x100) + 0x1c);
            *(undefined1 (*) [32])(local_5df0.ray + 0x100) = auVar58;
          }
          bVar32 = (byte)uVar45;
          bVar34 = (bool)((byte)(uVar45 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar45 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar45 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar45 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar45 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar45 >> 6) & 1);
          bVar9 = SUB81(uVar45 >> 7,0);
          *(uint *)local_5dc0 =
               (uint)(bVar32 & 1) * *(int *)local_5dc0 |
               (uint)!(bool)(bVar32 & 1) * local_5d80._0_4_;
          *(uint *)(local_5dc0 + 4) =
               (uint)bVar34 * *(int *)(local_5dc0 + 4) | (uint)!bVar34 * local_5d80._4_4_;
          *(uint *)(local_5dc0 + 8) =
               (uint)bVar4 * *(int *)(local_5dc0 + 8) | (uint)!bVar4 * local_5d80._8_4_;
          *(uint *)(local_5dc0 + 0xc) =
               (uint)bVar5 * *(int *)(local_5dc0 + 0xc) | (uint)!bVar5 * local_5d80._12_4_;
          *(uint *)(local_5dc0 + 0x10) =
               (uint)bVar6 * *(int *)(local_5dc0 + 0x10) | (uint)!bVar6 * local_5d80._16_4_;
          *(uint *)(local_5dc0 + 0x14) =
               (uint)bVar7 * *(int *)(local_5dc0 + 0x14) | (uint)!bVar7 * local_5d80._20_4_;
          *(uint *)(local_5dc0 + 0x18) =
               (uint)bVar8 * *(int *)(local_5dc0 + 0x18) | (uint)!bVar8 * local_5d80._24_4_;
          *(uint *)(local_5dc0 + 0x1c) =
               (uint)bVar9 * *(int *)(local_5dc0 + 0x1c) | (uint)!bVar9 * local_5d80._28_4_;
        }
        uVar35 = (uint)(bVar33 & ~bVar32);
      }
      lVar43 = lVar43 + 1;
      lVar36 = local_5d60._0_8_;
    } while ((char)uVar35 != '\0');
    bVar33 = 0;
LAB_01dd394a:
    lVar37 = local_5d98 + 1;
    lVar36 = lVar36 + 0x50;
    bVar33 = (byte)local_5df8 & bVar33;
    uVar35 = CONCAT31((int3)(local_5df8 >> 8),bVar33);
  } while (bVar33 != 0);
  uVar35 = 0;
LAB_01dd3968:
  bVar33 = (byte)local_5e24 | ~(byte)uVar35;
  local_5e24 = (uint)bVar33;
  if (bVar33 == 0xff) {
    local_5e24 = 0xff;
    goto LAB_01dd3a96;
  }
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_58a0._0_4_ =
       (uint)(bVar33 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar33 & 1) * local_58a0._0_4_;
  bVar34 = (bool)(bVar33 >> 1 & 1);
  local_58a0._4_4_ = (uint)bVar34 * auVar49._4_4_ | (uint)!bVar34 * local_58a0._4_4_;
  bVar34 = (bool)(bVar33 >> 2 & 1);
  local_58a0._8_4_ = (uint)bVar34 * auVar49._8_4_ | (uint)!bVar34 * local_58a0._8_4_;
  bVar34 = (bool)(bVar33 >> 3 & 1);
  local_58a0._12_4_ = (uint)bVar34 * auVar49._12_4_ | (uint)!bVar34 * local_58a0._12_4_;
  bVar34 = (bool)(bVar33 >> 4 & 1);
  local_58a0._16_4_ = (uint)bVar34 * auVar49._16_4_ | (uint)!bVar34 * local_58a0._16_4_;
  bVar34 = (bool)(bVar33 >> 5 & 1);
  local_58a0._20_4_ = (uint)bVar34 * auVar49._20_4_ | (uint)!bVar34 * local_58a0._20_4_;
  bVar34 = (bool)(bVar33 >> 6 & 1);
  local_58a0._24_4_ = (uint)bVar34 * auVar49._24_4_ | (uint)!bVar34 * local_58a0._24_4_;
  local_58a0._28_4_ =
       (uint)(bVar33 >> 7) * auVar49._28_4_ | (uint)!(bool)(bVar33 >> 7) * local_58a0._28_4_;
  goto LAB_01dd304a;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }